

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_SetRipMax(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  char *pcVar3;
  undefined8 *puVar4;
  bool bVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_006883ef;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar4 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar4 != (undefined8 *)0x0) {
        pPVar2 = (PClass *)puVar4[1];
        if (pPVar2 == (PClass *)0x0) {
          pPVar2 = (PClass *)(**(code **)*puVar4)(puVar4);
          puVar4[1] = pPVar2;
        }
        bVar5 = pPVar2 != (PClass *)0x0;
        if (pPVar2 != pPVar1 && bVar5) {
          do {
            pPVar2 = pPVar2->ParentClass;
            bVar5 = pPVar2 != (PClass *)0x0;
            if (pPVar2 == pPVar1) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_006883ef;
        }
        goto LAB_006883bd;
      }
    }
    else if (puVar4 != (undefined8 *)0x0) goto LAB_006883df;
    puVar4 = (undefined8 *)0x0;
LAB_006883bd:
    if (numparam == 1) {
      pcVar3 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        *(int *)(puVar4 + 0x80) = param[1].field_0.i;
        return 0;
      }
      pcVar3 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1b2f,"int AF_A_SetRipMax(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
LAB_006883df:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_006883ef:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x1b2e,"int AF_A_SetRipMax(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_SetRipMax)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(max);
	self->RipLevelMax = max;
	return 0;
}